

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 in_RAX;
  char **ppcVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  char *pcVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar11;
  byte *ptr_00;
  int tok;
  undefined8 uStack_38;
  uint uVar9;
  
  ppcVar5 = (char **)(end + -(long)ptr);
  if ((long)ppcVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar1 < 0x16) {
    if (bVar1 == 5) {
      if (ppcVar5 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,end,ppcVar5);
      lVar11 = 2;
    }
    else if (bVar1 == 6) {
      if ((long)ppcVar5 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,end,ppcVar5);
      lVar11 = 3;
    }
    else {
      if (bVar1 != 7) goto LAB_00408e94;
      if ((long)ppcVar5 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)ppcVar5);
      lVar11 = 4;
    }
    if (iVar4 == 0) {
LAB_00408e94:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  else {
    lVar11 = 1;
    if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto LAB_00408e94;
  }
  ptr_00 = (byte *)(ptr + lVar11);
  uVar3 = uStack_38;
  do {
    lVar11 = (long)end - (long)ptr_00;
    if (lVar11 < 1) {
      return -1;
    }
    uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
    uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
    uVar8 = uVar9 - 5;
    if (0x18 < uVar8) {
switchD_00408e19_caseD_8:
      pbVar7 = ptr_00;
LAB_00408fe2:
      *nextTokPtr = (char *)pbVar7;
      return 0;
    }
    lVar6 = 1;
    pcVar10 = (char *)((long)&switchD_00408e19::switchdataD_0057b484 +
                      (long)(int)(&switchD_00408e19::switchdataD_0057b484)[uVar8]);
    uStack_38 = uVar3;
    switch(uVar9) {
    case 5:
      if (lVar11 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[0])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar6 = 2;
      break;
    case 6:
      if (lVar11 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[1])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar6 = 3;
      break;
    case 7:
      if (lVar11 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[2])(enc,(char *)ptr_00,pcVar10,(char **)0x1);
      lVar6 = 4;
      break;
    default:
      goto switchD_00408e19_caseD_8;
    case 9:
    case 10:
    case 0x15:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar4 == 0) goto switchD_00408e19_caseD_1d;
      pbVar7 = ptr_00 + 1;
      uVar3 = extraout_RDX;
      uVar2 = uStack_38;
      goto joined_r0x00408ecc;
    case 0xf:
      iVar4 = normal_checkPiTarget
                        ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),(int *)0x1);
      if (iVar4 == 0) goto switchD_00408e19_caseD_1d;
      pbVar7 = ptr_00 + 1;
      if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
        return -1;
      }
      if (*pbVar7 != 0x3e) goto LAB_00408fe2;
      goto LAB_00408fc7;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_00408e19_caseD_16;
    case 0x1d:
      goto switchD_00408e19_caseD_1d;
    }
    uVar3 = uStack_38;
    if (iVar4 == 0) goto switchD_00408e19_caseD_1d;
switchD_00408e19_caseD_16:
    uStack_38 = uVar3;
    ptr_00 = ptr_00 + lVar6;
    uVar3 = uStack_38;
  } while( true );
joined_r0x00408ecc:
  ptr_00 = pbVar7;
  lVar11 = (long)end - (long)ptr_00;
  if (lVar11 < 1) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar2 >> 0x20);
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*ptr_00);
  if (0xf < (ulong)bVar1) {
switchD_00408ef1_caseD_2:
    pbVar7 = ptr_00 + 1;
    goto joined_r0x00408ecc;
  }
  uStack_38 = uVar2;
  switch(bVar1) {
  case 0:
  case 1:
  case 8:
switchD_00408e19_caseD_1d:
    *nextTokPtr = (char *)ptr_00;
    return 0;
  default:
    goto switchD_00408ef1_caseD_2;
  case 5:
    if (lVar11 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,(char *)ptr_00);
    if (iVar4 != 0) goto switchD_00408e19_caseD_1d;
    pbVar7 = ptr_00 + 2;
    uVar3 = extraout_RDX_00;
    uVar2 = uStack_38;
    break;
  case 6:
    if (lVar11 < 3) {
      return -2;
    }
    pcVar10 = (*enc[3].skipS)(enc,(char *)ptr_00);
    if ((int)pcVar10 != 0) goto switchD_00408e19_caseD_1d;
    pbVar7 = ptr_00 + 3;
    uVar3 = extraout_RDX_01;
    uVar2 = uStack_38;
    break;
  case 7:
    if (lVar11 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,(char *)ptr_00,(int)uVar3,
                              (ATTRIBUTE *)
                              ((long)&switchD_00408ef1::switchdataD_0057b4e8 +
                              (long)(int)(&switchD_00408ef1::switchdataD_0057b4e8)[bVar1]));
    if (iVar4 != 0) goto switchD_00408e19_caseD_1d;
    pbVar7 = ptr_00 + 4;
    uVar3 = extraout_RDX_02;
    uVar2 = uStack_38;
    break;
  case 0xf:
    pbVar7 = ptr_00 + 1;
    if ((byte *)end == pbVar7 || (long)end - (long)pbVar7 < 0) {
      return -1;
    }
    if (*pbVar7 == 0x3e) {
LAB_00408fc7:
      *nextTokPtr = (char *)(ptr_00 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x00408ecc;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}